

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_address.cpp
# Opt level: O3

void __thiscall
cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
          (ElementsConfidentialAddress *this,ElementsConfidentialAddress *object)

{
  core::Address::Address(&this->unblinded_address_);
  Pubkey::Pubkey(&this->confidential_key_);
  (this->address_)._M_dataplus._M_p = (pointer)&(this->address_).field_2;
  (this->address_)._M_string_length = 0;
  (this->address_).field_2._M_local_buf[0] = '\0';
  core::Address::operator=(&this->unblinded_address_,&object->unblinded_address_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->confidential_key_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&object->confidential_key_);
  ::std::__cxx11::string::_M_assign((string *)&this->address_);
  return;
}

Assistant:

ElementsConfidentialAddress::ElementsConfidentialAddress(
    const ElementsConfidentialAddress& object) {
  unblinded_address_ = object.unblinded_address_;
  confidential_key_ = object.confidential_key_;
  address_ = object.address_;
}